

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_upscale(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ulong uVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  long lVar27;
  undefined4 *puVar28;
  undefined8 uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  long local_d8;
  long local_c8;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    pcVar25 = "fatal error";
    uVar29 = 0x19d0;
LAB_001430f2:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar29,pcVar25);
  }
  lVar4 = dst->ne[0];
  sVar5 = pgVar3->nb[1];
  lVar6 = dst->ne[1];
  sVar7 = pgVar3->nb[2];
  lVar21 = (long)params->ith;
  lVar30 = (long)params->nth;
  sVar8 = dst->nb[0];
  sVar9 = pgVar3->nb[3];
  lVar10 = dst->ne[3];
  sVar11 = dst->nb[1];
  sVar12 = pgVar3->nb[0];
  lVar13 = dst->ne[2];
  sVar14 = dst->nb[2];
  fVar37 = (float)lVar4 / (float)pgVar3->ne[0];
  fVar38 = (float)lVar6 / (float)pgVar3->ne[1];
  fVar39 = (float)lVar13 / (float)pgVar3->ne[2];
  sVar15 = dst->nb[3];
  fVar40 = (float)lVar10 / (float)pgVar3->ne[3];
  if (dst->op_params[0] == 0) {
    if (0 < lVar10) {
      local_d8 = sVar14 * lVar21;
      local_c8 = 0;
      do {
        if (lVar21 < lVar13) {
          lVar22 = lVar21;
          lVar24 = local_d8;
          do {
            if (0 < lVar6) {
              lVar33 = 0;
              lVar27 = lVar24;
              do {
                if (0 < lVar4) {
                  lVar34 = 0;
                  pvVar16 = pgVar3->data;
                  puVar28 = (undefined4 *)((long)dst->data + lVar27);
                  do {
                    fVar41 = (float)lVar34;
                    lVar34 = lVar34 + 1;
                    *puVar28 = *(undefined4 *)
                                ((long)pvVar16 +
                                (long)(fVar41 / fVar37) * sVar12 +
                                (long)((float)lVar22 / fVar39) * sVar7 +
                                (long)((float)local_c8 / fVar40) * sVar9 +
                                (long)((float)lVar33 / fVar38) * sVar5);
                    puVar28 = (undefined4 *)((long)puVar28 + sVar8);
                  } while (lVar4 != lVar34);
                }
                lVar27 = lVar27 + sVar11;
                lVar33 = lVar33 + 1;
              } while (lVar33 != lVar6);
            }
            lVar22 = lVar22 + lVar30;
            lVar24 = lVar24 + sVar14 * lVar30;
          } while (lVar22 < lVar13);
        }
        local_d8 = local_d8 + sVar15;
        local_c8 = local_c8 + 1;
      } while (local_c8 != lVar10);
    }
  }
  else {
    if (dst->op_params[0] != 1) {
      pcVar25 = "unsupported upscale mode";
      uVar29 = 0x19bf;
      goto LAB_001430f2;
    }
    if (0 < lVar10) {
      local_a0 = sVar14 * lVar21;
      uVar2 = pgVar3->ne[1] - 1;
      uVar31 = pgVar3->ne[0] - 1;
      local_a8 = 0;
      do {
        if (lVar21 < lVar13) {
          local_90 = local_a0;
          lVar22 = (long)((float)local_a8 / fVar40) * sVar9;
          local_98 = lVar21;
          do {
            if (0 < lVar6) {
              lVar24 = 0;
              local_d8 = local_90;
              lVar27 = (long)((float)local_98 / fVar39) * sVar7;
              do {
                fVar41 = ((float)lVar24 + 0.5) / fVar38 + -0.5;
                auVar17 = vroundss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),9);
                uVar19 = (ulong)auVar17._0_4_;
                uVar23 = uVar19;
                if ((long)uVar2 < (long)uVar19) {
                  uVar23 = uVar2;
                }
                if (0 < lVar4) {
                  uVar23 = ~((long)uVar23 >> 0x3f) & uVar23;
                  uVar20 = uVar19 + 1;
                  if ((long)uVar2 < (long)(uVar19 + 1)) {
                    uVar20 = uVar2;
                  }
                  lVar33 = 0;
                  auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                       ZEXT416((uint)(fVar41 - (float)(long)uVar23)));
                  auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x40);
                  fVar41 = 1.0 - auVar17._0_4_;
                  pvVar16 = pgVar3->data;
                  puVar28 = (undefined4 *)((long)dst->data + local_d8);
                  do {
                    fVar42 = ((float)lVar33 + 0.5) / fVar37 + -0.5;
                    auVar18 = vroundss_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),9);
                    uVar35 = (ulong)auVar18._0_4_;
                    uVar19 = uVar31;
                    if ((long)uVar35 <= (long)uVar31) {
                      uVar19 = uVar35;
                    }
                    uVar32 = uVar31;
                    if ((long)(uVar35 + 1) <= (long)uVar31) {
                      uVar32 = uVar35 + 1;
                    }
                    lVar34 = (~((long)uVar20 >> 0x3f) & uVar20) * sVar5 + lVar27;
                    lVar33 = lVar33 + 1;
                    uVar19 = ~((long)uVar19 >> 0x3f) & uVar19;
                    lVar26 = uVar19 * sVar12;
                    lVar1 = uVar23 * sVar5 + lVar27;
                    lVar36 = (~((long)uVar32 >> 0x3f) & uVar32) * sVar12;
                    auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                         ZEXT416((uint)(fVar42 - (float)(long)uVar19)));
                    auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
                    fVar42 = auVar18._0_4_;
                    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar42 * *(float *)((long)
                                                  pvVar16 + lVar22 + lVar1 + lVar36))),
                                              ZEXT416((uint)fVar41),
                                              ZEXT416((uint)((1.0 - fVar42) *
                                                            *(float *)((long)pvVar16 +
                                                                      lVar22 + lVar1 + lVar26))));
                    auVar18 = vfmadd213ss_fma(ZEXT416((uint)((1.0 - fVar42) *
                                                            *(float *)((long)pvVar16 +
                                                                      lVar22 + lVar34 + lVar26))),
                                              auVar17,auVar18);
                    auVar18 = vfmadd213ss_fma(ZEXT416((uint)(fVar42 * *(float *)((long)pvVar16 +
                                                                                lVar22 + lVar34 + 
                                                  lVar36))),auVar17,auVar18);
                    *puVar28 = auVar18._0_4_;
                    puVar28 = (undefined4 *)((long)puVar28 + sVar8);
                  } while (lVar4 != lVar33);
                }
                local_d8 = local_d8 + sVar11;
                lVar24 = lVar24 + 1;
              } while (lVar24 != lVar6);
            }
            local_98 = local_98 + lVar30;
            local_90 = local_90 + sVar14 * lVar30;
          } while (local_98 < lVar13);
        }
        local_a0 = local_a0 + sVar15;
        local_a8 = local_a8 + 1;
      } while (local_a8 != lVar10);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_upscale(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_upscale_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}